

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O2

void Diligent::ValidatePSOCreateInfo<Diligent::ComputePipelineStateCreateInfo>
               (IRenderDevice *pDevice,ComputePipelineStateCreateInfo *CreateInfo)

{
  PIPELINE_TYPE PipelineType;
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char (*in_RCX) [19];
  char (*Args_1) [19];
  IShader *pIVar3;
  string msg;
  char *local_28;
  
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6d38b1,in_RCX);
    Args_1 = (char (*) [19])0x3b6;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidatePSOCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x3b6);
    std::__cxx11::string::~string((string *)&msg);
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6d38b1,Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2a5);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar2 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  PipelineType = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  if (PipelineType != PIPELINE_TYPE_COMPUTE) {
    msg._M_dataplus._M_p = GetPipelineTypeString(PipelineType);
    pcVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    local_28 = "";
    if (pcVar1 != (char *)0x0) {
      local_28 = pcVar1;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[31]>
              (false,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2aa,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6f56ca,
               &local_28,(char (*) [15])"\' is invalid: ",
               (char (*) [31])"Pipeline type must be COMPUTE.");
  }
  anon_unknown_61::ValidatePipelineResourceSignatures
            (&CreateInfo->super_PipelineStateCreateInfo,pDevice);
  anon_unknown_61::ValidatePipelineResourceLayoutDesc
            ((PipelineStateDesc *)CreateInfo,(DeviceFeatures *)(CONCAT44(extraout_var,iVar2) + 0xc))
  ;
  pIVar3 = CreateInfo->pCS;
  if (pIVar3 == (IShader *)0x0) {
    msg._M_dataplus._M_p =
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    pcVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    local_28 = "";
    if (pcVar1 != (char *)0x0) {
      local_28 = pcVar1;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[33]>
              (false,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2b0,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6f56ca,
               &local_28,(char (*) [15])"\' is invalid: ",
               (char (*) [33])"Compute shader must not be null.");
    pIVar3 = CreateInfo->pCS;
    if (pIVar3 == (IShader *)0x0) {
      return;
    }
  }
  iVar2 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var_00,iVar2) + 8) != 0x20) {
    iVar2 = (*(CreateInfo->pCS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    msg._M_dataplus._M_p =
         GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_01,iVar2) + 8));
    LogError<true,char_const*,char[26],char[8],char[8]>
              (false,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2b2,(char **)&msg,(char (*) [26])" is not a valid type for ",
               (char (*) [8])0x7b4565,(char (*) [8])0x76ed50);
  }
  return;
}

Assistant:

void ValidatePSOCreateInfo<ComputePipelineStateCreateInfo>(const IRenderDevice*                  pDevice,
                                                           const ComputePipelineStateCreateInfo& CreateInfo) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    ValidateComputePipelineCreateInfo(CreateInfo, pDevice);
}